

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Acb_TranslateCnf(Vec_Int_t *vClas,Vec_Int_t *vLits,Vec_Str_t *vCnf,Vec_Int_t *vSatVars,
                     int iPivotVar)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int *pMap;
  undefined4 local_34;
  int Lit;
  int i;
  char Entry;
  int iPivotVar_local;
  Vec_Int_t *vSatVars_local;
  Vec_Str_t *vCnf_local;
  Vec_Int_t *vLits_local;
  Vec_Int_t *vClas_local;
  
  for (local_34 = 0; iVar2 = Vec_StrSize(vCnf), local_34 < iVar2; local_34 = local_34 + 1) {
    cVar1 = Vec_StrEntry(vCnf,local_34);
    if (cVar1 == -1) {
      iVar2 = Vec_IntSize(vLits);
      Vec_IntPush(vClas,iVar2);
    }
    else {
      pMap = Vec_IntArray(vSatVars);
      iVar2 = Abc_Lit2LitV(pMap,(int)cVar1);
      iVar3 = Abc_Lit2Var(iVar2);
      iVar2 = Abc_LitNotCond(iVar2,(uint)(iVar3 == iPivotVar));
      Vec_IntPush(vLits,iVar2);
    }
  }
  return;
}

Assistant:

void Acb_TranslateCnf( Vec_Int_t * vClas, Vec_Int_t * vLits, Vec_Str_t * vCnf, Vec_Int_t * vSatVars, int iPivotVar )
{
    signed char Entry;
    int i, Lit;
    Vec_StrForEachEntry( vCnf, Entry, i )
    {
        if ( (int)Entry == -1 )
        {
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            continue;
        }
        Lit = Abc_Lit2LitV( Vec_IntArray(vSatVars), (int)Entry );
        Lit = Abc_LitNotCond( Lit, Abc_Lit2Var(Lit) == iPivotVar );
        Vec_IntPush( vLits, Lit );
    }
}